

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O3

s32 __thiscall irr::gui::CGUIEditBox::getLineFromPos(CGUIEditBox *this,s32 pos)

{
  pointer piVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  if ((this->WordWrap != false) || (iVar3 = 0, this->MultiLine == true)) {
    piVar1 = (this->BrokenTextPositions).m_data.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = (uint)((ulong)((long)(this->BrokenTextPositions).m_data.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        if (pos < piVar1[uVar4]) {
          uVar2 = (uint)uVar4;
          break;
        }
        uVar4 = uVar4 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar4);
    }
    iVar3 = uVar2 - 1;
  }
  return iVar3;
}

Assistant:

s32 CGUIEditBox::getLineFromPos(s32 pos)
{
	if (!WordWrap && !MultiLine)
		return 0;

	s32 i = 0;
	while (i < (s32)BrokenTextPositions.size()) {
		if (BrokenTextPositions[i] > pos)
			return i - 1;
		++i;
	}
	return (s32)BrokenTextPositions.size() - 1;
}